

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

double computeObjectiveValue(HighsLp *lp,HighsSolution *solution)

{
  double dVar1;
  const_reference pvVar2;
  long in_RSI;
  int *in_RDI;
  HighsInt iCol;
  double objective_value;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_1c);
    dVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)local_1c);
    local_18 = dVar1 * *pvVar2 + local_18;
  }
  return *(double *)(in_RDI + 0x3e) + local_18;
}

Assistant:

double computeObjectiveValue(const HighsLp& lp, const HighsSolution& solution) {
  double objective_value = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    objective_value += lp.col_cost_[iCol] * solution.col_value[iCol];
  objective_value += lp.offset_;
  return objective_value;
}